

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O0

void pstore::log<char_const*>(priority p,czstring message,char *d)

{
  vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
  *this;
  bool bVar1;
  long *plVar2;
  undefined8 *puVar3;
  reference this_00;
  pointer plVar4;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  iterator __end3;
  iterator __begin3;
  logger_collection *__range3;
  char *d_local;
  czstring message_local;
  priority p_local;
  
  plVar2 = (long *)details::log_destinations();
  if (*plVar2 != 0) {
    puVar3 = (undefined8 *)details::log_destinations();
    this = (vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
            *)*puVar3;
    __end3 = std::
             vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
             ::begin(this);
    destination = (unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *)
                  std::
                  vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>
                  ::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_*,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>
                                       *)&destination), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_*,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>
                ::operator*(&__end3);
      plVar4 = std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>::operator->
                         (this_00);
      (*plVar4->_vptr_logger[10])(plVar4,(ulong)p,message,d);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_*,_std::vector<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>,_std::allocator<std::unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_>_>_>_>
      ::operator++(&__end3);
    }
  }
  return;
}

Assistant:

inline void log (logger::priority p, gsl::czstring message, T d) {
            if (details::log_destinations != nullptr) {
                for (std::unique_ptr<logger> & destination : *details::log_destinations) {
                    destination->log (p, message, d);
                }
            }
        }